

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void chaiscript::detail::Dispatch_Engine::save_function_params
               (Stack_Holder *t_s,
               vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_params)

{
  bool bVar1;
  reference this;
  reference this_00;
  __normal_iterator<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
  local_48;
  const_iterator local_40;
  reference local_38;
  Boxed_Value *param;
  iterator __end2;
  iterator __begin2;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *__range2;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_params_local;
  Stack_Holder *t_s_local;
  
  __end2 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
                     (t_params);
  param = (Boxed_Value *)
          std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::end
                    (t_params);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                      (&__end2,(__normal_iterator<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
                                *)&param);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_38 = __gnu_cxx::
               __normal_iterator<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
               ::operator*(&__end2);
    this = std::
           vector<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_std::allocator<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
           ::back(&t_s->call_params);
    this_00 = std::
              vector<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_std::allocator<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
              ::back(&t_s->call_params);
    local_48._M_current =
         (Boxed_Value *)
         std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::begin
                   (this_00);
    __gnu_cxx::
    __normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
    ::__normal_iterator<chaiscript::Boxed_Value*>
              ((__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
                *)&local_40,&local_48);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::insert
              (this,local_40,local_38);
    __gnu_cxx::
    __normal_iterator<chaiscript::Boxed_Value_*,_std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

static void save_function_params(Stack_Holder &t_s, std::vector<Boxed_Value> &&t_params) {
        for (auto &&param : t_params) {
          t_s.call_params.back().insert(t_s.call_params.back().begin(), std::move(param));
        }
      }